

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O2

int __thiscall mahjong::PlayerHand::remove(PlayerHand *this,char *__filename)

{
  multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_> *this_00;
  uint __line;
  size_type sVar1;
  iterator iVar2;
  char *__assertion;
  Tile tile_local;
  
  tile_local = (Tile)__filename;
  this_00 = &this->tiles;
  sVar1 = std::
          _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
          ::count(&this_00->_M_t,&tile_local);
  if (sVar1 == 0) {
    __assertion = "0 < tiles.count(tile)";
    __line = 0x13;
  }
  else {
    if ((this->ready_type == not_ready) || (this->last_tile == tile_local)) {
      iVar2 = std::
              _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
              ::find(&this_00->_M_t,&tile_local);
      iVar2 = std::
              _Rb_tree<mahjong::Tile,mahjong::Tile,std::_Identity<mahjong::Tile>,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>
              ::erase_abi_cxx11_((_Rb_tree<mahjong::Tile,mahjong::Tile,std::_Identity<mahjong::Tile>,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>
                                  *)this_00,iVar2._M_node);
      return (int)iVar2._M_node;
    }
    __assertion = "ready_type == ReadyType::not_ready || last_tile == tile";
    __line = 0x14;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/player-hand.cpp"
                ,__line,"void mahjong::PlayerHand::remove(Tile)");
}

Assistant:

void PlayerHand::remove(Tile tile)
{
	assert(0 < tiles.count(tile));
	assert(ready_type == ReadyType::not_ready || last_tile == tile);

	auto it = tiles.find(tile);
	tiles.erase(it);
}